

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

int __thiscall phosg::toupper(phosg *this,int __c)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  long lVar5;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,__c);
  *(phosg **)this = this + 0x10;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (phosg)0x0;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,plVar4[1]);
  lVar1 = plVar4[1];
  if (lVar1 != 0) {
    lVar2 = *plVar4;
    lVar5 = 0;
    do {
      iVar3 = ::toupper((int)*(char *)(lVar2 + lVar5));
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char)iVar3);
      lVar5 = lVar5 + 1;
    } while (lVar1 != lVar5);
  }
  return (int)this;
}

Assistant:

string toupper(const string& s) {
  string ret;
  ret.reserve(s.size());
  for (char ch : s) {
    ret.push_back(::toupper(ch));
  }
  return ret;
}